

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm_decoder.cpp
# Opt level: O0

BlockOrRecord * __thiscall
LLVMBC::BitcodeReader::ReadToplevelBlock(BlockOrRecord *__return_storage_ptr__,BitcodeReader *this)

{
  uint uVar1;
  size_t bitWidth;
  uint32_t abbrevID;
  BitcodeReader *this_local;
  BlockOrRecord *ret;
  
  BlockOrRecord::BlockOrRecord(__return_storage_ptr__);
  bitWidth = abbrevSize(this);
  uVar1 = BitReader::fixed<unsigned_int>(&this->b,bitWidth);
  if (uVar1 != 1) {
    __assert_fail("abbrevID == ENTER_SUBBLOCK",
                  "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/bc-decoder/llvm_decoder.cpp"
                  ,0x6a,"BlockOrRecord LLVMBC::BitcodeReader::ReadToplevelBlock()");
  }
  ReadBlockContents(this,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

BlockOrRecord BitcodeReader::ReadToplevelBlock()
{
  BlockOrRecord ret;

  // should hit ENTER_SUBBLOCK first for top-level block
  uint32_t abbrevID = b.fixed<uint32_t>(abbrevSize());
  (void)abbrevID;
  assert(abbrevID == ENTER_SUBBLOCK);

  ReadBlockContents(ret);

  return ret;
}